

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_ast.c
# Opt level: O0

gnode_t * gnode_function_decl_create
                    (gtoken_s token,char *identifier,gtoken_t access_specifier,
                    gtoken_t storage_specifier,gnode_r *params,gnode_compound_stmt_t *block,
                    gnode_t *decl)

{
  gnode_t *pgVar1;
  gnode_function_decl_t *node;
  gnode_t *decl_local;
  gnode_compound_stmt_t *block_local;
  gnode_r *params_local;
  gtoken_t storage_specifier_local;
  gtoken_t access_specifier_local;
  char *identifier_local;
  
  pgVar1 = (gnode_t *)gravity_calloc((gravity_vm *)0x0,1,0x88);
  pgVar1->tag = NODE_FUNCTION_DECL;
  memcpy(&pgVar1->token,&token,0x28);
  pgVar1->decl = decl;
  *(char **)&pgVar1[1].token.colno = identifier;
  pgVar1[1].block_length = access_specifier;
  *(gtoken_t *)&pgVar1[1].field_0xc = storage_specifier;
  *(gnode_r **)&pgVar1[1].token.bytes = params;
  *(gnode_compound_stmt_t **)&pgVar1[1].token.fileid = block;
  *(undefined2 *)&pgVar1[1].token.value = 0;
  *(undefined8 *)&pgVar1[1].is_assignment = 0;
  return pgVar1;
}

Assistant:

gnode_t *gnode_function_decl_create (gtoken_s token, const char *identifier, gtoken_t access_specifier, gtoken_t storage_specifier, gnode_r *params,
                                     gnode_compound_stmt_t *block, gnode_t *decl) {
    gnode_function_decl_t *node = (gnode_function_decl_t *)mem_alloc(NULL, sizeof(gnode_function_decl_t));

    SETBASE(node, NODE_FUNCTION_DECL, token);
    SETDECL(node, decl);
    node->identifier = identifier;
    node->access = access_specifier;
    node->storage = storage_specifier;
    node->params = params;
    node->block = block;
    node->nlocals = 0;
    node->uplist = NULL;

    return (gnode_t *)node;
}